

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall MPLSParser::SubPath_extension(MPLSParser *this,BitStreamWriter *writer)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  uint *puVar6;
  uint32_t uVar7;
  MPLSStreamInfo *pMVar8;
  size_t subPathNum;
  size_t i;
  ulong playItemNum;
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  pmtIndexList;
  
  puVar5 = (writer->super_BitStream).m_buffer;
  puVar6 = (writer->super_BitStream).m_initBuffer;
  uVar1 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,0x20,0);
  iVar2 = *(int *)&(writer->super_BitStream).m_buffer;
  iVar3 = *(int *)&(writer->super_BitStream).m_initBuffer;
  uVar4 = writer->m_bitWrited;
  subPathNum = 0xfffffffffffffff8;
  BitStreamWriter::putBits(writer,8,0);
  BitStreamWriter::putBits(writer,8,8);
  BitStreamWriter::putBits(writer,0xf,0);
  BitStreamWriter::putBit(writer,0);
  BitStreamWriter::putBits(writer,8,0);
  pMVar8 = getMVCDependStream(this);
  std::
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ::vector(&pmtIndexList,&(pMVar8->super_M2TSStreamInfo).m_index);
  BitStreamWriter::putBits
            (writer,8,(uint)(((long)pmtIndexList.
                                    super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)pmtIndexList.
                                   super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x30));
  for (playItemNum = 0;
      playItemNum <
      (ulong)(((long)pmtIndexList.
                     super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)pmtIndexList.
                    super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x30);
      playItemNum = playItemNum + 1) {
    composeSubPlayItem(this,writer,playItemNum,subPathNum,&pmtIndexList);
  }
  uVar7 = my_ntohl((int)((iVar2 - iVar3) * 8 + uVar4) / -8 +
                   (int)((*(int *)&(writer->super_BitStream).m_buffer -
                         *(int *)&(writer->super_BitStream).m_initBuffer) * 8 + writer->m_bitWrited)
                   / 8);
  *(uint32_t *)((long)puVar6 + (long)((int)(uVar1 + ((int)puVar5 - (int)puVar6) * 8) / 8)) = uVar7;
  std::
  vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
  ::~vector(&pmtIndexList);
  return;
}

Assistant:

void MPLSParser::SubPath_extension(BitStreamWriter& writer)
{
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // length
    const int beforeCount = writer.getBitsCount() / 8;

    writer.putBits(8, 0);   // reserved
    writer.putBits(8, 8);   // SubPath_type = 8
    writer.putBits(15, 0);  // reserved
    writer.putBit(0);       // is_repeat_SubPath
    writer.putBits(8, 0);   // reserved

    const std::vector<PMTIndex> pmtIndexList = getMVCDependStream().m_index;
    writer.putBits(8, static_cast<unsigned>(pmtIndexList.size()));  // number_of_SubPlayItems
    for (size_t i = 0; i < pmtIndexList.size(); ++i) composeSubPlayItem(writer, i, 0, pmtIndexList);

    *lengthPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
}